

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_CutRef2_rec(Of_Man_t *p,int *pCut)

{
  uint Entry;
  int iVar1;
  int *pCut_00;
  uint v;
  int local_34;
  
  if ((p->Iter & 1) == 0) {
    local_34 = 0;
    if (1 < (*pCut & 0x1fU)) {
      local_34 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  else {
    local_34 = 1;
  }
  v = 0;
  while( true ) {
    if ((*pCut & 0x1fU) <= v) {
      return local_34;
    }
    Entry = Of_CutVar(pCut,v);
    if (Entry == 0) break;
    if (p->pObjs[Entry].iCutH != 0) {
      Vec_IntPush(&p->vCutRefs,Entry);
      iVar1 = p->pObjs[Entry].nRefs;
      p->pObjs[Entry].nRefs = iVar1 + 1;
      if (iVar1 == 0) {
        pCut_00 = Of_ObjCutBestP(p,Entry);
        iVar1 = Of_CutRef2_rec(p,pCut_00);
        local_34 = local_34 + iVar1;
      }
    }
    v = v + 1;
  }
  return local_34;
}

Assistant:

int Of_CutRef2_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
    {
        if ( !Of_ObjCutBest(p, Var) )
            continue;
        Vec_IntPush( &p->vCutRefs, Var );
        if ( Of_ObjRefInc(p, Var) )
            continue;
        Count += Of_CutRef2_rec( p, Of_ObjCutBestP(p, Var) );
    }
    return Count;
}